

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall
cmMakefile::HaveCxxStandardAvailable(cmMakefile *this,cmTarget *target,string *feature)

{
  char *test;
  char **ppcVar1;
  char *pcVar2;
  char **ppcVar3;
  ostream *poVar4;
  bool needCxx11;
  bool needCxx98;
  bool local_269;
  string local_268;
  cmStrCmp local_248;
  cmStrCmp local_228;
  cmStrCmp local_208;
  cmStrCmp local_1e8;
  cmStrCmp local_1c8;
  ostringstream e;
  
  std::__cxx11::string::string((string *)&e,"CMAKE_CXX_STANDARD_DEFAULT",(allocator *)&local_268);
  test = GetDefinition(this,(string *)&e);
  std::__cxx11::string::~string((string *)&e);
  if (test == (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    std::operator<<((ostream *)&e,
                    "CMAKE_CXX_STANDARD_DEFAULT is not set.  COMPILE_FEATURES support not fully configured for this compiler."
                   );
    std::__cxx11::stringbuf::str();
    IssueMessage(this,INTERNAL_ERROR,&local_268,false);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    return true;
  }
  cmStrCmp::cmStrCmp(&local_1c8,test);
  ppcVar1 = std::find_if<char_const*const*,cmStrCmp>
                      (CXX_STANDARDS,&PTR_anon_var_dwarf_10f416_00595a68,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  if (ppcVar1 == &PTR_anon_var_dwarf_10f416_00595a68) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar4 = std::operator<<((ostream *)&e,
                             "The CMAKE_CXX_STANDARD_DEFAULT variable contains an invalid value: \""
                            );
    poVar4 = std::operator<<(poVar4,test);
    std::operator<<(poVar4,"\".");
    std::__cxx11::stringbuf::str();
    IssueMessage(this,INTERNAL_ERROR,&local_268,false);
  }
  else {
    needCxx98 = false;
    needCxx11 = false;
    CheckNeededCxxLanguage(this,feature,&needCxx98,&needCxx11,&local_269);
    std::__cxx11::string::string((string *)&e,"CXX_STANDARD",(allocator *)&local_268);
    pcVar2 = cmTarget::GetProperty(target,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    if (pcVar2 != (char *)0x0) {
      test = pcVar2;
    }
    cmStrCmp::cmStrCmp(&local_1e8,test);
    ppcVar1 = std::find_if<char_const*const*,cmStrCmp>
                        (CXX_STANDARDS,&PTR_anon_var_dwarf_10f416_00595a68,&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    if (ppcVar1 != &PTR_anon_var_dwarf_10f416_00595a68) {
      cmStrCmp::cmStrCmp(&local_208,test);
      ppcVar1 = std::find_if<char_const*const*,cmStrCmp>
                          (CXX_STANDARDS,&PTR_anon_var_dwarf_10f416_00595a68,&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      if (needCxx11 == true) {
        cmStrCmp::cmStrCmp(&local_228,"11");
        ppcVar3 = std::find_if<char_const*const*,cmStrCmp>
                            (CXX_STANDARDS,&PTR_anon_var_dwarf_10f416_00595a68,&local_228);
        std::__cxx11::string::~string((string *)&local_228);
        if (ppcVar1 < ppcVar3) {
          return false;
        }
      }
      if (needCxx98 == true) {
        cmStrCmp::cmStrCmp(&local_248,"98");
        ppcVar3 = std::find_if<char_const*const*,cmStrCmp>
                            (CXX_STANDARDS,&PTR_anon_var_dwarf_10f416_00595a68,&local_248);
        std::__cxx11::string::~string((string *)&local_248);
        return ppcVar3 <= ppcVar1;
      }
      return true;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar4 = std::operator<<((ostream *)&e,"The CXX_STANDARD property on target \"");
    poVar4 = std::operator<<(poVar4,(string *)&target->Name);
    poVar4 = std::operator<<(poVar4,"\" contained an invalid value: \"");
    poVar4 = std::operator<<(poVar4,test);
    std::operator<<(poVar4,"\".");
    std::__cxx11::stringbuf::str();
    IssueMessage(this,FATAL_ERROR,&local_268,false);
  }
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  return false;
}

Assistant:

bool cmMakefile::HaveCxxStandardAvailable(cmTarget const* target,
                                         const std::string& feature) const
{
  const char* defaultCxxStandard =
    this->GetDefinition("CMAKE_CXX_STANDARD_DEFAULT");
  if (!defaultCxxStandard)
    {
    std::ostringstream e;
    e << "CMAKE_CXX_STANDARD_DEFAULT is not set.  COMPILE_FEATURES support "
      "not fully configured for this compiler.";
    this->IssueMessage(cmake::INTERNAL_ERROR, e.str());
    // Return true so the caller does not try to lookup the default standard.
    return true;
    }
  if (std::find_if(cmArrayBegin(CXX_STANDARDS), cmArrayEnd(CXX_STANDARDS),
                cmStrCmp(defaultCxxStandard)) == cmArrayEnd(CXX_STANDARDS))
    {
    std::ostringstream e;
    e << "The CMAKE_CXX_STANDARD_DEFAULT variable contains an "
         "invalid value: \"" << defaultCxxStandard << "\".";
    this->IssueMessage(cmake::INTERNAL_ERROR, e.str());
    return false;
    }

  bool needCxx98 = false;
  bool needCxx11 = false;
  bool needCxx14 = false;
  this->CheckNeededCxxLanguage(feature, needCxx98, needCxx11, needCxx14);

  const char *existingCxxStandard = target->GetProperty("CXX_STANDARD");
  if (!existingCxxStandard)
    {
    existingCxxStandard = defaultCxxStandard;
    }

  if (std::find_if(cmArrayBegin(CXX_STANDARDS), cmArrayEnd(CXX_STANDARDS),
                cmStrCmp(existingCxxStandard)) == cmArrayEnd(CXX_STANDARDS))
    {
    std::ostringstream e;
    e << "The CXX_STANDARD property on target \"" << target->GetName()
      << "\" contained an invalid value: \"" << existingCxxStandard << "\".";
    this->IssueMessage(cmake::FATAL_ERROR, e.str());
    return false;
    }

  const char * const *existingCxxIt = existingCxxStandard
                                    ? std::find_if(cmArrayBegin(CXX_STANDARDS),
                                      cmArrayEnd(CXX_STANDARDS),
                                      cmStrCmp(existingCxxStandard))
                                    : cmArrayEnd(CXX_STANDARDS);

  if (needCxx11 && existingCxxIt < std::find_if(cmArrayBegin(CXX_STANDARDS),
                                      cmArrayEnd(CXX_STANDARDS),
                                      cmStrCmp("11")))
    {
    return false;
    }
  else if(needCxx98 && existingCxxIt <
                                    std::find_if(cmArrayBegin(CXX_STANDARDS),
                                      cmArrayEnd(CXX_STANDARDS),
                                      cmStrCmp("98")))
    {
    return false;
    }
  return true;
}